

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

void tinyobj::SplitString
               (string *s,char delim,char escape,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *elems)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  string token;
  value_type local_48;
  
  paVar1 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  if (s->_M_string_length != 0) {
    uVar4 = 0;
    bVar3 = false;
    do {
      cVar2 = (s->_M_dataplus)._M_p[uVar4];
      if (bVar3) {
LAB_00151624:
        std::__cxx11::string::push_back((char)&local_48);
LAB_0015162f:
        bVar3 = false;
      }
      else {
        if (cVar2 != '\\') {
          if (cVar2 != ' ') goto LAB_00151624;
          if (local_48._M_string_length != 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)CONCAT71(in_register_00000031,delim),&local_48);
          }
          local_48._M_string_length = 0;
          *local_48._M_dataplus._M_p = '\0';
          goto LAB_0015162f;
        }
        bVar3 = true;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < s->_M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT71(in_register_00000031,delim),&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void SplitString(const std::string &s, char delim, char escape,
                        std::vector<std::string> &elems) {
  std::string token;

  bool escaping = false;
  for (int i = 0; i < s.size(); ++i) {
    char ch = s[i];
    if (escaping) {
      escaping = false;
    } else if (ch == escape) {
      escaping = true;
      continue;
    } else if (ch == delim) {
      if (!token.empty()) {
        elems.push_back(token);
      }
      token.clear();
      continue;
    }
    token += ch;
  }

  elems.push_back(token);
}